

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFiltersExport.cpp
# Opt level: O3

void helicsFilterAddDestinationTarget(HelicsFilter filt,char *dest,HelicsError *err)

{
  Filter *this;
  FilterObject *pFVar1;
  size_t sVar2;
  string_view newTarget;
  
  pFVar1 = anon_unknown.dwarf_ba607::getFilterObj(filt,err);
  if ((pFVar1 != (FilterObject *)0x0) && (this = pFVar1->filtPtr, this != (Filter *)0x0)) {
    if (dest == (char *)0x0) {
      if (err != (HelicsError *)0x0) {
        err->error_code = -4;
        err->message = "The supplied string argument is null and therefore invalid";
      }
    }
    else {
      sVar2 = strlen(dest);
      newTarget._M_str = dest;
      newTarget._M_len = sVar2;
      helics::Interface::addDestinationTarget(&this->super_Interface,newTarget,UNKNOWN);
    }
  }
  return;
}

Assistant:

void helicsFilterAddDestinationTarget(HelicsFilter filt, const char* dest, HelicsError* err)
{
    auto* filter = getFilter(filt, err);
    if (filter == nullptr) {
        return;
    }
    CHECK_NULL_STRING(dest, void());
    try {
        filter->addDestinationTarget(dest);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}